

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_get_unique(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  size_t sVar2;
  CVmObjVector *this_00;
  char *__src;
  vm_val_t *in_RDX;
  size_t cnt;
  CVmObjVector *new_vec;
  CVmNativeCodeDesc *in_stack_ffffffffffffff98;
  CVmRun *in_stack_ffffffffffffffa0;
  vm_val_t *in_stack_ffffffffffffffa8;
  vm_val_t *val;
  
  if ((getp_get_unique(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_unique(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_unique::desc,0);
    __cxa_guard_release(&getp_get_unique(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffa8,(uint *)in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    CVmRun::push_obj(in_stack_ffffffffffffffa0,
                     (vm_obj_id_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    sVar2 = get_element_count((CVmObjVector *)0x3a0528);
    val = in_RDX;
    obj = create((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(size_t)in_RDX);
    vm_val_t::set_obj(in_RDX,obj);
    CVmStack::push(val);
    vm_objp(0);
    set_element_count((CVmObjVector *)in_stack_ffffffffffffffa0,(size_t)in_RDX);
    this_00 = (CVmObjVector *)
              get_element_ptr((CVmObjVector *)in_stack_ffffffffffffffa0,(size_t)in_RDX);
    __src = get_element_ptr(this_00,(size_t)in_RDX);
    sVar2 = calc_alloc_ele(sVar2);
    memcpy(this_00,__src,sVar2);
    cons_uniquify((CVmObjVector *)val);
    CVmStack::discard(2);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_get_unique(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                  uint *argc)
{
    CVmObjVector *new_vec;
    size_t cnt;
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* put myself on the stack for GC protection */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   allocate a new vector for the return value - the new vector will
     *   never be any larger than the original 
     */
    cnt = get_element_count();
    retval->set_obj(create(vmg_ FALSE, cnt));

    /* push a reference to the new list for gc protection */
    G_stk->push(retval);

    /* get the return value as a vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);

    /* start out with the result element count the same as my own */
    new_vec->set_element_count(cnt);

    /* copy my elements to the new vector */
    memcpy(new_vec->get_element_ptr(0), get_element_ptr(0),
           calc_alloc_ele(cnt));

    /* uniquify the result */
    new_vec->cons_uniquify(vmg0_);

    /* discard the gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}